

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_timepicker.cpp
# Opt level: O0

void QtMWidgets::TimePicker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  time_t tVar2;
  undefined4 in_register_00000034;
  void *_v_1;
  TimePicker *_t_1;
  void *_v;
  TimePicker *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == ReadProperty) {
    puVar1 = (undefined4 *)*_a;
    if (_id == 0) {
      tVar2 = DateTimePicker::time((DateTimePicker *)_o,(time_t *)CONCAT44(in_register_00000034,_c))
      ;
      *puVar1 = (int)tVar2;
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    DateTimePicker::setTime((DateTimePicker *)_o,(QTime *)*_a);
  }
  return;
}

Assistant:

void QtMWidgets::TimePicker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<TimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QTime*>(_v) = _t->time(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<TimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTime(*reinterpret_cast< QTime*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}